

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputPrint(Node *this,ostream *os)

{
  int iVar1;
  Node *this_00;
  
  IOChPrinted = '\0';
  IOChannel = (Node *)0x0;
  IOUsing = (Node *)0x0;
  this_00 = this->Tree[0];
  if (this_00 != (Node *)0x0) {
    iVar1 = OutputPrintData(this_00,os,0);
    if (IOUsing != (Node *)0x0) {
      OutputIPChannel(this_00,os,0);
      this_00 = (Node *)os;
      std::__ostream_insert<char,std::char_traits<char>>(os," << PUse.Finish()",0x11);
    }
    if (iVar1 == 0) goto LAB_0011d12e;
  }
  OutputIPChannel(this_00,os,0);
  std::__ostream_insert<char,std::char_traits<char>>(os," << std::endl",0xd);
LAB_0011d12e:
  if (IOChPrinted == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    std::ostream::put((char)os);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void Node::OutputPrint(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	int ReturnFlag = 0;

	//
	// Indent as necessary
	//
	IOChPrinted = 0;	// IO Channel not yet output
	IOChannel = 0;		// No IO Channel defined yet
	IOUsing = 0;		// No Print Using Statement yet

	//
	// Output print using
	//
	if (Tree[0] != 0)
	{
		//
		// Handle print statement
		//
		ReturnFlag = Tree[0]->OutputPrintData(os, 0);

		//
		// Finish off print using statement
		//
		if (IOUsing != 0)
		{
			OutputIPChannel(os, 0);
			os << " << PUse.Finish()";
		}

		//
		// Force a return at end of line?
		//
		if (ReturnFlag != 0)
		{
			if ((IOChannel == 0) || (IOChPrinted != 0))
			{
				OutputIPChannel(os, 0);
				os << " << std::endl";
			}
			else
			{
				//
				// When using a BChannel, it doesn't handle this
				// case properly in C++, so fake it.
				//
				OutputIPChannel(os, 0);
				os << " << std::endl";
			}
		}
	}
	else
	{
		//
		// Empty print command
		//
		if ((IOChannel == 0) || (IOChPrinted != 0))
		{
			OutputIPChannel(os, 0);
			os << " << std::endl";
		}
		else
		{
			//
			// When using a BChannel, it doesn't handle this
			// case properly in C++, so fake it.
			//
			OutputIPChannel(os, 0);
			os << " << std::endl";
		}
	}

	//
	// Close off statement
	//
	if (IOChPrinted != 0)
	{
		os << ";" << std::endl;
	}
}